

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_constants_level_max(parser *p)

{
  wchar_t wVar1;
  int iVar2;
  void *pvVar3;
  char *__s1;
  wchar_t value;
  char *label;
  angband_constants *z;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  __s1 = parser_getsym(p,"label");
  wVar1 = parser_getint(p,"value");
  if (wVar1 < L'\0') {
    p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    iVar2 = strcmp(__s1,"monsters");
    if (iVar2 == 0) {
      *(short *)((long)pvVar3 + 0x34) = (short)wVar1;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    else {
      p_local._4_4_ = PARSE_ERROR_UNDEFINED_DIRECTIVE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_constants_level_max(struct parser *p) {
	struct angband_constants *z;
	const char *label;
	int value;

	z = parser_priv(p);
	label = parser_getsym(p, "label");
	value = parser_getint(p, "value");

	if (value < 0)
		return PARSE_ERROR_INVALID_VALUE;

	if (streq(label, "monsters"))
		z->level_monster_max = value;
	else
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;

	return PARSE_ERROR_NONE;
}